

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

bool CoreML::hasIOS14NeuralNetworkFeatures(Model *model)

{
  uint32 uVar1;
  bool bVar2;
  RepeatedPtrFieldBase *this;
  Type *this_00;
  SliceDynamicLayerParams *pSVar3;
  UpsampleLayerParams *pUVar4;
  ReorganizeDataLayerParams *pRVar5;
  InnerProductLayerParams *pIVar6;
  BatchedMatMulLayerParams *pBVar7;
  ConcatNDLayerParams *pCVar8;
  bool bVar9;
  int i;
  int index;
  
  bVar2 = hasDefaultValueForOptionalInputs(model);
  bVar9 = true;
  if (!bVar2) {
    this = &getNNSpec(model)->super_RepeatedPtrFieldBase;
    index = 0;
    if (this == (RepeatedPtrFieldBase *)0x0) {
      bVar9 = false;
    }
    else {
      for (; bVar9 = index < this->current_size_, index < this->current_size_; index = index + 1) {
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                            (this,index);
        uVar1 = this_00->_oneof_case_[0];
        if (uVar1 == 0x8c) {
LAB_0021d3a6:
          pIVar6 = Specification::NeuralNetworkLayer::innerproduct(this_00);
          if (pIVar6->int8dynamicquantize_ != false) {
            return bVar9;
          }
LAB_0021d3b4:
          pBVar7 = Specification::NeuralNetworkLayer::batchedmatmul(this_00);
          if (pBVar7->int8dynamicquantize_ != false) {
            return bVar9;
          }
LAB_0021d3c2:
          pCVar8 = Specification::NeuralNetworkLayer::concatnd(this_00);
          if (pCVar8->interleave_ != false) {
            return bVar9;
          }
        }
        else {
          if (uVar1 == 0xd2) {
LAB_0021d37c:
            pUVar4 = Specification::NeuralNetworkLayer::upsample(this_00);
            if (pUVar4->linearupsamplemode_ != 0) {
              return bVar9;
            }
            pUVar4 = Specification::NeuralNetworkLayer::upsample(this_00);
            if (0 < (pUVar4->fractionalscalingfactor_).current_size_) {
              return bVar9;
            }
LAB_0021d398:
            pRVar5 = Specification::NeuralNetworkLayer::reorganizedata(this_00);
            if (pRVar5->mode_ == 2) {
              return bVar9;
            }
            goto LAB_0021d3a6;
          }
          if (uVar1 == 0x159) goto LAB_0021d398;
          if (uVar1 == 0x3d4) goto LAB_0021d3c2;
          if (uVar1 == 1000) {
            if ((this_00->input_).super_RepeatedPtrFieldBase.current_size_ == 7) {
              return bVar9;
            }
            pSVar3 = Specification::NeuralNetworkLayer::slicedynamic(this_00);
            if ((pSVar3->squeezemasks_).current_size_ != 0) {
              return bVar9;
            }
            goto LAB_0021d37c;
          }
          if (uVar1 == 0x415) goto LAB_0021d3b4;
          if ((uVar1 - 0x5aa < 0x16) && ((0x318c21U >> (uVar1 - 0x5aa & 0x1f) & 1) != 0)) {
            return bVar9;
          }
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool CoreML::hasIOS14NeuralNetworkFeatures(const Specification::Model& model) {

    // Return True if the model has the new Neural network features added in
    // ios 14

    if (hasDefaultValueForOptionalInputs(model)) {
        return true;
    }


    auto layers = getNNSpec(model);
    if (layers) {
        for (int i=0; i<layers->size(); i++){
            const Specification::NeuralNetworkLayer& layer = (*layers)[i];
            switch (layer.layer_case()) {
                case Specification::NeuralNetworkLayer::kCumSum:
                case Specification::NeuralNetworkLayer::kOneHot:
                case Specification::NeuralNetworkLayer::kClampedReLU:
                case Specification::NeuralNetworkLayer::kArgSort:
                case Specification::NeuralNetworkLayer::kPooling3D:
                case Specification::NeuralNetworkLayer::kGlobalPooling3D:
                case Specification::NeuralNetworkLayer::kSliceBySize:
                case Specification::NeuralNetworkLayer::kConvolution3D:
                    return true;
                case Specification::NeuralNetworkLayer::kSliceDynamic:
                    if (layer.input().size() == 7) {
                        return true;
                    } else if (layer.slicedynamic().squeezemasks_size()) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kUpsample:
                    if (layer.upsample().linearupsamplemode() != Specification::UpsampleLayerParams_LinearUpsampleMode_DEFAULT) {
                        return true;
                    }
                    if (layer.upsample().fractionalscalingfactor_size() > 0) {
                        return true;
                    }
                case Specification::NeuralNetworkLayer::kReorganizeData:
                    if (layer.reorganizedata().mode() == Specification::ReorganizeDataLayerParams::PIXEL_SHUFFLE) {
                      return true;
                    }
                case Specification::NeuralNetworkLayer::kInnerProduct:
                    if (layer.innerproduct().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kBatchedMatmul:
                    if (layer.batchedmatmul().int8dynamicquantize())
                        return true;
                case Specification::NeuralNetworkLayer::kConcatND:
                    if (layer.concatnd().interleave()) {
                        return true;
                    }
                default:
                    continue;
            }
        }
    }
    return false;
}